

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O1

HtaFile * __thiscall hta::storage::file::Metric::file_hta(Metric *this,Duration interval)

{
  _Rb_tree_header *p_Var1;
  map<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>_>
  *this_00;
  Mode MVar2;
  _Base_ptr p_Var3;
  undefined1 auVar4 [12];
  key_type kVar5;
  _Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>
  _Var6;
  _Base_ptr p_Var7;
  uint unaff_EBP;
  Header *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>,_bool>
  pVar8;
  Write local_b9;
  key_type local_b8;
  Header local_b0;
  int64_t local_78;
  int64_t local_70;
  int64_t local_68;
  int64_t local_60;
  Header local_58;
  
  p_Var1 = &(this->files_hta_)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = (_Base_ptr)p_Var1;
  for (p_Var3 = (_Base_ptr)(this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
      ; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(long *)(p_Var3 + 1) < interval.__r])
  {
    if (interval.__r <= *(long *)(p_Var3 + 1)) {
      p_Var7 = p_Var3;
    }
  }
  _Var6._M_node = (_Base_ptr)p_Var1;
  if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
     (_Var6._M_node = p_Var7, interval.__r < *(long *)(p_Var7 + 1))) {
    _Var6._M_node = (_Base_ptr)p_Var1;
  }
  if ((_Rb_tree_header *)_Var6._M_node != p_Var1) goto LAB_0016affd;
  this_00 = &this->files_hta_;
  MVar2 = this->open_mode_;
  local_b8.__r = interval.__r;
  if (MVar2 == read_write) {
    path_hta_abi_cxx11_((path *)&local_b0,this,interval);
    kVar5.__r = local_b8.__r;
    (**(this->super_Metric)._vptr_Metric)(&local_b0.interval_factor,this);
    local_58.version = 2;
    local_58.interval = kVar5.__r;
    local_58.duration_period.num = 1;
    local_58.duration_period.den = 1000000000;
    local_58.interval_min = local_b0.interval_factor;
    local_58.interval_factor = local_78;
    local_58.interval_max = local_b0.interval_max;
    pVar8 = std::
            map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
            ::
            try_emplace<hta::storage::file::FileOpenTag::ReadWrite,std::filesystem::__cxx11::path,hta::storage::file::Metric::Header>
                      ((map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
                        *)this_00,&local_b8,(ReadWrite *)&local_b9,(path *)&local_b0,&local_58);
    auVar4 = pVar8._0_12_;
LAB_0016afe8:
    _Var6._M_node = auVar4._0_8_;
    unaff_EBP = auVar4._8_4_;
    this_01 = &local_b0;
LAB_0016aff2:
    Catch::clara::std::filesystem::__cxx11::path::~path((path *)this_01);
  }
  else {
    if (MVar2 == write) {
      path_hta_abi_cxx11_((path *)&local_b0,this,interval);
      kVar5.__r = local_b8.__r;
      (**(this->super_Metric)._vptr_Metric)(&local_70,this);
      local_58.version = 2;
      local_58.interval = kVar5.__r;
      local_58.duration_period.num = 1;
      local_58.duration_period.den = 1000000000;
      local_58.interval_min = local_70;
      local_58.interval_factor = local_60;
      local_58.interval_max = local_68;
      pVar8 = std::
              map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
              ::
              try_emplace<hta::storage::file::FileOpenTag::Write,std::filesystem::__cxx11::path,hta::storage::file::Metric::Header>
                        ((map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
                          *)this_00,&local_b8,&local_b9,(path *)&local_b0,&local_58);
      auVar4 = pVar8._0_12_;
      goto LAB_0016afe8;
    }
    if (MVar2 == read) {
      path_hta_abi_cxx11_((path *)&local_58,this,interval);
      pVar8 = std::
              map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
              ::try_emplace<hta::storage::file::FileOpenTag::Read,std::filesystem::__cxx11::path>
                        ((map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
                          *)this_00,&local_b8,(Read *)&local_b0,(path *)&local_58);
      _Var6 = pVar8.first._M_node;
      unaff_EBP = pVar8._8_4_;
      this_01 = &local_58;
      goto LAB_0016aff2;
    }
  }
  if ((unaff_EBP & 1) == 0) {
    __assert_fail("added",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                  ,0x226,"Metric::HtaFile &hta::storage::file::Metric::file_hta(Duration)");
  }
LAB_0016affd:
  return (HtaFile *)&_Var6._M_node[1]._M_parent;
}

Assistant:

Metric::HtaFile& Metric::file_hta(Duration interval)
{
    auto it = files_hta_.find(interval);
    if (it == files_hta_.end())
    {
        bool added;
        switch (open_mode_)
        {
        case Mode::read:
            std::tie(it, added) =
                files_hta_.try_emplace(interval, FileOpenTag::Read(), path_hta(interval));
            break;
        case Mode::write:
            std::tie(it, added) = files_hta_.try_emplace(
                interval, FileOpenTag::Write(), path_hta(interval), Header(interval, meta()));
            break;
        case Mode::read_write:
            std::tie(it, added) = files_hta_.try_emplace(
                interval, FileOpenTag::ReadWrite(), path_hta(interval), Header(interval, meta()));
            break;
        }
        assert(added);
    }
    return it->second;
}